

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_stage3_avx2(__m256i *x)

{
  __m256i *in_stack_00000040;
  __m256i *in_stack_00000048;
  
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

static inline void iadst16_stage3_avx2(__m256i *x) {
  btf_16_adds_subs_avx2(&x[0], &x[8]);
  btf_16_adds_subs_avx2(&x[1], &x[9]);
  btf_16_adds_subs_avx2(&x[2], &x[10]);
  btf_16_adds_subs_avx2(&x[3], &x[11]);
  btf_16_adds_subs_avx2(&x[4], &x[12]);
  btf_16_adds_subs_avx2(&x[5], &x[13]);
  btf_16_adds_subs_avx2(&x[6], &x[14]);
  btf_16_adds_subs_avx2(&x[7], &x[15]);
}